

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O1

void __thiscall
vkt::Draw::PipelineCreateInfo::MultiSampleState::MultiSampleState
          (MultiSampleState *this,MultiSampleState *other)

{
  uint *__first;
  allocator_type local_31;
  void *local_30 [2];
  long local_20;
  
  (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_VkPipelineMultisampleStateCreateInfo).sType =
       (other->super_VkPipelineMultisampleStateCreateInfo).sType;
  (this->super_VkPipelineMultisampleStateCreateInfo).pNext =
       (other->super_VkPipelineMultisampleStateCreateInfo).pNext;
  (this->super_VkPipelineMultisampleStateCreateInfo).flags =
       (other->super_VkPipelineMultisampleStateCreateInfo).flags;
  (this->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples =
       (other->super_VkPipelineMultisampleStateCreateInfo).rasterizationSamples;
  (this->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable =
       (other->super_VkPipelineMultisampleStateCreateInfo).sampleShadingEnable;
  (this->super_VkPipelineMultisampleStateCreateInfo).minSampleShading =
       (other->super_VkPipelineMultisampleStateCreateInfo).minSampleShading;
  __first = (other->super_VkPipelineMultisampleStateCreateInfo).pSampleMask;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_30,__first,
             __first + ((ulong)(other->super_VkPipelineMultisampleStateCreateInfo).
                               rasterizationSamples + 0x20 >> 5),&local_31);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->m_sampleMask,local_30);
  if (local_30[0] != (void *)0x0) {
    operator_delete(local_30[0],local_20 - (long)local_30[0]);
  }
  (this->super_VkPipelineMultisampleStateCreateInfo).pSampleMask =
       (this->m_sampleMask).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  return;
}

Assistant:

PipelineCreateInfo::MultiSampleState::MultiSampleState (const MultiSampleState& other)
{
	sType					= other.sType;
	pNext					= other.pNext;
	flags					= other.flags;
	rasterizationSamples	= other.rasterizationSamples;
	sampleShadingEnable		= other.sampleShadingEnable;
	minSampleShading		= other.minSampleShading;

	const size_t sampleMaskArrayLen = (sizeof(vk::VkSampleMask) * 8 + other.rasterizationSamples) / (sizeof(vk::VkSampleMask) * 8);

	m_sampleMask	= std::vector<vk::VkSampleMask>(other.pSampleMask, other.pSampleMask + sampleMaskArrayLen);
	pSampleMask		= &m_sampleMask[0];
}